

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::scan
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  pointer pcVar1;
  char cVar2;
  pointer pcVar3;
  char32_t *pcVar4;
  pointer pCVar5;
  bool bVar6;
  
  std::
  vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ::resize(&this->props_,
           (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2);
  pcVar3 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar3 != pcVar1) {
    pCVar5 = (this->props_).
             super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar2 = u_hasBinaryProperty_70(*pcVar3,0x1e);
      pCVar5->uppercase = cVar2 != '\0';
      pcVar3 = pcVar3 + 1;
      pCVar5 = pCVar5 + 1;
    } while (pcVar3 != pcVar1);
  }
  if (this->case_sensitive_ != false) {
    pcVar3 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar3 == pcVar1) {
      bVar6 = true;
    }
    else {
      pcVar4 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      while ((bVar6 = pcVar4 != (this->item_).
                                super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                                super__Vector_impl_data._M_finish, bVar6 &&
             ((*pcVar4 != *pcVar3 || (pcVar3 = pcVar3 + 1, pcVar3 != pcVar1))))) {
        pcVar4 = pcVar4 + 1;
      }
    }
    return bVar6;
  }
  bVar6 = scan_match<false>(this);
  return bVar6;
}

Assistant:

bool scan() {
    props_.resize(item_.size());
    auto props_it = props_.begin();
    for (auto item_it = item_.cbegin(), item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->uppercase = StringTraits::is_uppercase(*item_it);
    }
    if (case_sensitive_) {
      return scan_match<true>();
    } else {
      return scan_match<false>();
    }
  }